

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_parser.cpp
# Opt level: O2

CommandPacket CommandParser::checkForCommands(DebugInterface *serialLog,NetInterface *wifi)

{
  ulong uVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  WifiDebugOstream *pWVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_type sVar10;
  ulong uVar11;
  WifiDebugOstream log;
  
  log.m_lastWasNewline = true;
  log.m_wifiDebug = wifi;
  log.m_serialDebug = serialLog;
  if (checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_
                               );
    if (iVar4 != 0) {
      checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_dataplus._M_p =
           (pointer)&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_.field_2;
      checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_string_length = 0;
      checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_);
    }
  }
  uVar8 = 0xffffffff00000000;
  iVar4 = (*wifi->_vptr_NetInterface[3])
                    (wifi,&log,&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_)
  ;
  sVar3 = checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_string_length;
  _Var2 = checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_dataplus;
  uVar9 = 0xc;
  if ((char)iVar4 != '\0') {
    for (sVar10 = 0; sVar3 != sVar10; sVar10 = sVar10 + 1) {
      iVar4 = tolower((int)_Var2._M_p[sVar10]);
      _Var2._M_p[sVar10] = (char)iVar4;
    }
    pWVar6 = operator<<(&log,"Got: ");
    pWVar6 = operator<<(pWVar6,&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_)
    ;
    operator<<(pWVar6,"\n");
    uVar1 = DAT_0011f138;
    for (uVar11 = commandTemplates; uVar11 != uVar1; uVar11 = uVar11 + 0x28) {
      lVar7 = std::__cxx11::string::find
                        ((string *)
                         &checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_,uVar11
                        );
      if (lVar7 == 0) {
        uVar9 = (ulong)*(uint *)(uVar11 + 0x20);
        if (*(int *)(uVar11 + 0x24) == 0) {
          uVar5 = process_int(&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_,
                              *(long *)(uVar11 + 8) + 1);
          uVar8 = (ulong)uVar5 << 0x20;
        }
        break;
      }
    }
  }
  return (CommandPacket)(uVar9 | uVar8);
}

Assistant:

const CommandPacket checkForCommands( 
	DebugInterface& serialLog, 
	NetInterface& wifi  )
{
	CommandPacket result;
  
  WifiDebugOstream log( &serialLog, &wifi );

  // Read the first line of the request.  

  static std::string command;
  bool dataReady = wifi.getString( log, command );
  if ( !dataReady )
  {
    return result;
  }

  std::transform( command.begin(), command.end(), command.begin(), ::tolower);

  log << "Got: " << command << "\n";

  for ( const CommandTemplate& ct : commandTemplates )
  {
    if ( command.find(ct.inputCommand ) == 0 )
    {
      result.command = ct.outputCommand;
      if ( ct.hasArg == HasArg::Yes )
      {
        result.optionalArg =  process_int( command,  ct.inputCommand.length()+1  );
      } 
      return result;
    }
  } 
  return result;

}